

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tableref.hpp
# Opt level: O0

ExpressionListRef * __thiscall duckdb::TableRef::Cast<duckdb::ExpressionListRef>(TableRef *this)

{
  string *msg;
  ExpressionListRef *in_RDI;
  allocator *this_00;
  allocator local_29;
  string local_28 [40];
  
  if ((in_RDI->super_TableRef).type != EXPRESSION_LIST) {
    msg = (string *)__cxa_allocate_exception(0x10);
    this_00 = &local_29;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              (local_28,"Failed to cast constraint to type - constraint type mismatch",this_00);
    InternalException::InternalException((InternalException *)this_00,msg);
    __cxa_throw(msg,&InternalException::typeinfo,InternalException::~InternalException);
  }
  return in_RDI;
}

Assistant:

TARGET &Cast() {
		if (type != TARGET::TYPE && TARGET::TYPE != TableReferenceType::INVALID) {
			throw InternalException("Failed to cast constraint to type - constraint type mismatch");
		}
		return reinterpret_cast<TARGET &>(*this);
	}